

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodeToFile(ObjEncoder *this,PointCloud *pc,string *file_name)

{
  bool bVar1;
  pointer *__ptr;
  EncoderBuffer buffer;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  
  FileWriterFactory::OpenWriter((string *)local_58);
  if ((long *)local_58._0_8_ == (long *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->file_name_);
    EncoderBuffer::EncoderBuffer((EncoderBuffer *)(local_58 + 8));
    bVar1 = EncodeToBuffer(this,pc,(EncoderBuffer *)(local_58 + 8));
    if (bVar1) {
      (**(code **)(*(long *)local_58._0_8_ + 0x10))
                (local_58._0_8_,local_58._8_8_,local_48[0]._M_allocated_capacity - local_58._8_8_);
    }
    EncoderBuffer::~EncoderBuffer((EncoderBuffer *)(local_58 + 8));
    if ((long *)local_58._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 8))();
    }
  }
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeToFile(const PointCloud &pc,
                              const std::string &file_name) {
  std::unique_ptr<FileWriterInterface> file =
      FileWriterFactory::OpenWriter(file_name);
  if (!file) {
    return false;  // File could not be opened.
  }
  file_name_ = file_name;
  // Encode the mesh into a buffer.
  EncoderBuffer buffer;
  if (!EncodeToBuffer(pc, &buffer)) {
    return false;
  }
  // Write the buffer into the file.
  file->Write(buffer.data(), buffer.size());
  return true;
}